

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_job_queue_post(ma_job_queue *pQueue,ma_job *pJob)

{
  ma_uint64 *pmVar1;
  ma_spinlock mVar2;
  ulong uVar3;
  anon_union_8_2_cf9b0fbd_for_toc aVar4;
  ma_result mVar5;
  ulong uVar6;
  long lVar7;
  ma_job *pmVar8;
  ma_job *pmVar9;
  bool bVar10;
  byte bVar11;
  ma_uint64 slot;
  ushort local_20;
  undefined2 uStack_1e;
  undefined4 uStack_1c;
  
  bVar11 = 0;
  mVar5 = MA_INVALID_ARGS;
  if ((pJob != (ma_job *)0x0 && pQueue != (ma_job_queue *)0x0) &&
     (mVar5 = ma_slot_allocator_alloc(&pQueue->allocator,(ma_uint64 *)&local_20),
     mVar5 == MA_SUCCESS)) {
    aVar4.breakup.refcount = uStack_1c;
    aVar4.allocation._0_4_ = CONCAT22(uStack_1e,local_20);
    if (pQueue->capacity <= (uint)local_20) {
      __assert_fail("ma_job_extract_slot(slot) < pQueue->capacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                    ,0x16fe,"ma_result ma_job_queue_post(ma_job_queue *, const ma_job *)");
    }
    uVar6 = (ulong)CONCAT22(uStack_1e,local_20) & 0xffff;
    pmVar8 = pJob;
    pmVar9 = pQueue->pJobs + uVar6;
    for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
      pmVar9->toc = pmVar8->toc;
      pmVar8 = (ma_job *)((long)pmVar8 + (ulong)bVar11 * -0x10 + 8);
      pmVar9 = (ma_job *)((long)pmVar9 + (ulong)bVar11 * -0x10 + 8);
    }
    pQueue->pJobs[uVar6].toc = aVar4;
    pQueue->pJobs[local_20].toc.breakup.code = (pJob->toc).breakup.code;
    pQueue->pJobs[local_20].next = 0xffffffffffffffff;
    while( true ) {
      LOCK();
      mVar2 = pQueue->lock;
      pQueue->lock = 1;
      UNLOCK();
      if (mVar2 == 0) break;
      do {
      } while (pQueue->lock == 1);
    }
    do {
      while( true ) {
        do {
          uVar6 = pQueue->tail;
          uVar3 = pQueue->pJobs[uVar6 & 0xffff].next;
        } while (((pQueue->tail ^ uVar6) & 0xffffffff0000ffff) != 0);
        if ((uVar3 & 0xffff) == 0xffff) break;
        LOCK();
        if (uVar6 == pQueue->tail) {
          pQueue->tail = uVar3 & 0xffff | (uVar6 & 0xffffffff00000000) + 0x100000000;
        }
        UNLOCK();
      }
      pmVar1 = &pQueue->pJobs[uVar6 & 0xffff].next;
      LOCK();
      bVar10 = uVar3 == *pmVar1;
      if (bVar10) {
        *pmVar1 = (uVar3 & 0xffffffff00000000) + 0x100000000 | (ulong)CONCAT22(uStack_1e,local_20);
      }
      UNLOCK();
    } while (!bVar10);
    LOCK();
    if (uVar6 == pQueue->tail) {
      pQueue->tail = (uVar6 & 0xffffffff00000000) + 0x100000000 |
                     (ulong)CONCAT22(uStack_1e,local_20);
    }
    UNLOCK();
    pQueue->lock = 0;
    mVar5 = MA_SUCCESS;
    if ((pQueue->flags & 1) == 0) {
      ma_semaphore_release(&pQueue->sem);
    }
  }
  return mVar5;
}

Assistant:

MA_API ma_result ma_job_queue_post(ma_job_queue* pQueue, const ma_job* pJob)
{
    /*
    Lock free queue implementation based on the paper by Michael and Scott: Nonblocking Algorithms and Preemption-Safe Locking on Multiprogrammed Shared Memory Multiprocessors
    */
    ma_result result;
    ma_uint64 slot;
    ma_uint64 tail;
    ma_uint64 next;

    if (pQueue == NULL || pJob == NULL) {
        return MA_INVALID_ARGS;
    }

    /* We need a new slot. */
    result = ma_slot_allocator_alloc(&pQueue->allocator, &slot);
    if (result != MA_SUCCESS) {
        return result;  /* Probably ran out of slots. If so, MA_OUT_OF_MEMORY will be returned. */
    }

    /* At this point we should have a slot to place the job. */
    MA_ASSERT(ma_job_extract_slot(slot) < pQueue->capacity);

    /* We need to put the job into memory before we do anything. */
    pQueue->pJobs[ma_job_extract_slot(slot)]                  = *pJob;
    pQueue->pJobs[ma_job_extract_slot(slot)].toc.allocation   = slot;                    /* This will overwrite the job code. */
    pQueue->pJobs[ma_job_extract_slot(slot)].toc.breakup.code = pJob->toc.breakup.code;  /* The job code needs to be applied again because the line above overwrote it. */
    pQueue->pJobs[ma_job_extract_slot(slot)].next             = MA_JOB_ID_NONE;          /* Reset for safety. */

    #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
    ma_spinlock_lock(&pQueue->lock);
    #endif
    {
        /* The job is stored in memory so now we need to add it to our linked list. We only ever add items to the end of the list. */
        for (;;) {
            tail = c89atomic_load_64(&pQueue->tail);
            next = c89atomic_load_64(&pQueue->pJobs[ma_job_extract_slot(tail)].next);

            if (ma_job_toc_to_allocation(tail) == ma_job_toc_to_allocation(c89atomic_load_64(&pQueue->tail))) {
                if (ma_job_extract_slot(next) == 0xFFFF) {
                    if (ma_job_queue_cas(&pQueue->pJobs[ma_job_extract_slot(tail)].next, next, slot)) {
                        break;
                    }
                } else {
                    ma_job_queue_cas(&pQueue->tail, tail, ma_job_extract_slot(next));
                }
            }
        }
        ma_job_queue_cas(&pQueue->tail, tail, slot);
    }
    #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
    ma_spinlock_unlock(&pQueue->lock);
    #endif


    /* Signal the semaphore as the last step if we're using synchronous mode. */
    if ((pQueue->flags & MA_JOB_QUEUE_FLAG_NON_BLOCKING) == 0) {
        #ifndef MA_NO_THREADING
        {
            ma_semaphore_release(&pQueue->sem);
        }
        #else
        {
            MA_ASSERT(MA_FALSE);    /* Should never get here. Should have been checked at initialization time. */
        }
        #endif
    }

    return MA_SUCCESS;
}